

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O3

void memory_tree_ns::single_query_and_learn
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,example *ec)

{
  uint64_t *puVar1;
  polylabel *ppVar2;
  uint cn_00;
  uint32_t uVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  node *pnVar6;
  double dVar7;
  wclass *pwVar8;
  label_t unaff_RBP;
  ulong uVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float weight;
  uint32_t cn;
  labels preds;
  labels multilabels;
  float local_c0;
  uint local_bc;
  float *local_b8;
  float *pfStack_b0;
  float *local_a8;
  size_t sStack_a0;
  polyprediction *local_98;
  wclass **local_90;
  v_array<unsigned_int> local_88;
  v_array<unsigned_int> local_68;
  wclass *local_48;
  size_t sStack_40;
  
  local_68.end_array = (uint *)0x0;
  local_68.erase_count = 0;
  local_68._begin = (uint *)0x0;
  local_68._end = (uint *)0x0;
  route_to_leaf(b,base,ec_array_index,0,&local_68,false);
  if (4 < (ulong)((long)local_68._end - (long)local_68._begin)) {
    fVar11 = merand48(&b->all->random_state);
    cn_00 = local_68._begin
            [(long)(fVar11 * (float)(ulong)((long)local_68._end - (long)local_68._begin >> 2)) &
             0xffffffff];
    local_bc = cn_00;
    if ((b->nodes)._begin[cn_00].internal == -1) {
      local_c0 = 1.0;
      if (b->learn_at_leaf == 1) {
        learn_at_leaf_random(b,base,&local_bc,ec,&local_c0);
      }
      if (b->oas == 1) {
        local_88.end_array = (uint *)0x0;
        local_88.erase_count = 0;
        local_88._begin = (uint *)0x0;
        local_88._end = (uint *)0x0;
        collect_labels_from_leaf(b,cn_00,&local_88);
        pwVar4 = (ec->l).cs.costs._begin;
        pwVar5 = (ec->l).cs.costs._end;
        local_90 = &(ec->l).cs.costs.end_array;
        local_48 = (ec->l).cs.costs.end_array;
        sStack_40 = (ec->l).cs.costs.erase_count;
        local_98 = &ec->pred;
        local_b8 = (ec->pred).scalars._begin;
        pfStack_b0 = (ec->pred).scalars._end;
        local_a8 = (ec->pred).scalars.end_array;
        sStack_a0 = (ec->pred).scalars.erase_count;
        *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
        if (local_88._end != local_88._begin) {
          uVar9 = 0;
          do {
            (ec->l).multi.label = 0xbf800000;
            fVar11 = *(float *)((long)local_88._begin + uVar9 * 4);
            for (pwVar8 = pwVar4; pwVar8 != pwVar5; pwVar8 = (wclass *)&pwVar8->class_index) {
              if (pwVar8->x == fVar11) {
                (ec->l).multi.label = 0x3f800000;
                fVar11 = *(float *)((long)local_88._begin + uVar9 * 4);
                break;
              }
            }
            iVar10 = (int)b->max_routers + (int)fVar11 + 1;
            puVar1 = &(ec->super_example_predict).ft_offset;
            *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar10);
            (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec)
            ;
            puVar1 = &(ec->super_example_predict).ft_offset;
            *puVar1 = *puVar1 - (ulong)(uint)(iVar10 * *(int *)(base + 0xe0));
            uVar9 = uVar9 + 1;
          } while (uVar9 < (ulong)((long)local_88._end - (long)local_88._begin >> 2));
        }
        (local_98->scalars).end_array = local_a8;
        (local_98->scalars).erase_count = sStack_a0;
        (local_98->scalars)._begin = local_b8;
        (local_98->scalars)._end = pfStack_b0;
        (ec->l).cs.costs._begin = pwVar4;
        (ec->l).cs.costs._end = pwVar5;
        *local_90 = local_48;
        local_90[1] = (wclass *)sStack_40;
      }
    }
    else {
      fVar11 = merand48(&b->all->random_state);
      fVar12 = (float)(ulong)((long)local_68._end - (long)local_68._begin >> 2);
      fVar12 = fVar12 / (fVar12 + -1.0);
      pnVar6 = (b->nodes)._begin;
      if (fVar11 < 0.5) {
        fVar12 = return_reward_from_node(b,base,pnVar6[cn_00].right,ec,fVar12);
        fVar11 = b->alpha;
        pnVar6 = (b->nodes)._begin;
        dVar7 = log(pnVar6[cn_00].nl / pnVar6[cn_00].nr);
        dVar7 = dVar7 * (1.0 - (double)fVar11) + (double)((fVar12 + fVar12) * b->alpha) * 0.5;
      }
      else {
        fVar12 = return_reward_from_node(b,base,pnVar6[cn_00].left,ec,fVar12);
        fVar11 = b->alpha;
        pnVar6 = (b->nodes)._begin;
        dVar7 = log(pnVar6[cn_00].nl / pnVar6[cn_00].nr);
        dVar7 = dVar7 * (1.0 - (double)fVar11) +
                ((double)fVar12 + (double)fVar12) * (double)b->alpha * -0.5;
      }
      ppVar2 = &ec->l;
      if (b->oas == 0) {
        unaff_RBP = ppVar2->multi;
      }
      else {
        local_88._begin = *(uint **)&ppVar2->multi;
        local_88._end = (uint *)(ec->l).cs.costs._end;
        local_88.end_array = (uint *)(ec->l).cs.costs.end_array;
        local_88.erase_count = (ec->l).cs.costs.erase_count;
        local_b8 = (ec->pred).scalars._begin;
        pfStack_b0 = (ec->pred).scalars._end;
        local_a8 = (ec->pred).scalars.end_array;
        sStack_a0 = (ec->pred).scalars.erase_count;
      }
      fVar11 = ec->weight;
      fVar12 = ABS((float)dVar7);
      ec->weight = fVar12;
      fVar13 = 100.0;
      if ((100.0 <= fVar12) || (fVar13 = 0.01, fVar12 < 0.01)) {
        ec->weight = fVar13;
      }
      (ec->l).simple.label = *(float *)(&DAT_00281e50 + (ulong)((float)dVar7 < 0.0) * 4);
      *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0x3f800000;
      uVar3 = (b->nodes)._begin[cn_00].base_router;
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(base + 0xe0) * uVar3);
      (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar3 * *(int *)(base + 0xe0));
      if (b->oas == 0) {
        ppVar2->multi = unaff_RBP;
      }
      else {
        (ec->pred).scalars.end_array = local_a8;
        (ec->pred).scalars.erase_count = sStack_a0;
        (ec->pred).scalars._begin = local_b8;
        (ec->pred).scalars._end = pfStack_b0;
        (ec->l).cs.costs.end_array = (wclass *)local_88.end_array;
        (ec->l).cs.costs.erase_count = local_88.erase_count;
        ppVar2->multi = (label_t)local_88._begin;
        (ec->l).cs.costs._end = (wclass *)local_88._end;
      }
      ec->weight = fVar11;
    }
  }
  if (local_68._begin != (uint *)0x0) {
    free(local_68._begin);
  }
  return;
}

Assistant:

void single_query_and_learn(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, example& ec){
        v_array<uint32_t> path_to_leaf = v_init<uint32_t>();
		route_to_leaf(b, base, ec_array_index, 0, path_to_leaf, false); //no insertion happens here.

        if (path_to_leaf.size() > 1){
            //uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()-1);
            uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()); //include leaf
            uint32_t cn = path_to_leaf[random_pos];
            
            if (b.nodes[cn].internal != -1){ //if it's an internal node:' 
                float objective = 0.f;
                float prob_right = 0.5;
                float coin = merand48(b.all->random_state) < prob_right ? 1.f : -1.f;
                float weight = path_to_leaf.size()*1.f/(path_to_leaf.size() - 1.f);
                if (coin == -1.f){ //go left
                    float reward_left_subtree = return_reward_from_node(b,base, b.nodes[cn].left, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(-reward_left_subtree/(1.-prob_right))/2.;
                }
                else{ //go right:
                    float reward_right_subtree= return_reward_from_node(b,base, b.nodes[cn].right, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(reward_right_subtree/prob_right)/2.;
                }
                
                float ec_input_weight = ec.weight;
                
                MULTICLASS::label_t mc;
                MULTILABEL::labels multilabels;
                MULTILABEL::labels preds;
                if (b.oas == false)
                    mc = ec.l.multi;
                else{
                    multilabels = ec.l.multilabels;
                    preds = ec.pred.multilabels;
                }
                
                ec.weight = fabs(objective);
                if (ec.weight >= 100.f) //crop the weight, otherwise sometimes cause NAN outputs.
                    ec.weight = 100.f;
                else if (ec.weight < .01f)
                    ec.weight = 0.01f;
                ec.l.simple = {objective < 0. ? -1.f : 1.f, 1.f, 0.};
                base.learn(ec, b.nodes[cn].base_router);
               
                if (b.oas == false)
                    ec.l.multi = mc;
                else{
                    ec.pred.multilabels = preds;
                    ec.l.multilabels = multilabels;
                }
                ec.weight = ec_input_weight; //restore the original weight
            }
            else{ //if it's a leaf node:
                float weight = 1.f; //float(path_to_leaf.size());
                if (b.learn_at_leaf == true)
                    learn_at_leaf_random(b, base, cn, ec, weight); //randomly sample one example, query reward, and update leaf learner

                if (b.oas == true)
                    train_one_against_some_at_leaf(b,base, cn, ec);
            }
        }
        path_to_leaf.delete_v();
    }